

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

ParseLocation __thiscall
google::protobuf::TextFormat::ParseInfoTree::GetLocation
          (ParseInfoTree *this,FieldDescriptor *field,int index)

{
  _Base_ptr p_Var1;
  ulong uVar2;
  ulong uVar3;
  _Base_ptr p_Var4;
  int iVar5;
  _Rb_tree_header *p_Var6;
  
  CheckFieldIndex(field,index);
  p_Var6 = &(this->locations_)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &p_Var6->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0;
      p_Var4 = (&p_Var4->_M_left)[*(FieldDescriptor **)(p_Var4 + 1) < field]) {
    if (*(FieldDescriptor **)(p_Var4 + 1) >= field) {
      p_Var1 = p_Var4;
    }
  }
  p_Var4 = &p_Var6->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var6) &&
     (p_Var4 = p_Var1, field < *(FieldDescriptor **)(p_Var1 + 1))) {
    p_Var4 = &p_Var6->_M_header;
  }
  uVar3 = 0xffffffff00000000;
  uVar2 = 0xffffffff;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    iVar5 = 0;
    if (index != -1) {
      iVar5 = index;
    }
    if ((ulong)(long)iVar5 < (ulong)((long)p_Var4[1]._M_left - (long)p_Var4[1]._M_parent >> 3)) {
      uVar2 = *(ulong *)(&(p_Var4[1]._M_parent)->_M_color + (long)iVar5 * 2);
      uVar3 = uVar2 & 0xffffffff00000000;
      uVar2 = uVar2 & 0xffffffff;
    }
  }
  return (ParseLocation)(uVar2 | uVar3);
}

Assistant:

TextFormat::ParseLocation TextFormat::ParseInfoTree::GetLocation(
    const FieldDescriptor* field, int index) const {
  CheckFieldIndex(field, index);
  if (index == -1) { index = 0; }

  const std::vector<TextFormat::ParseLocation>* locations =
      FindOrNull(locations_, field);
  if (locations == NULL || index >= locations->size()) {
    return TextFormat::ParseLocation();
  }

  return (*locations)[index];
}